

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

void __thiscall
TPZBlockDiagonal<std::complex<double>_>::Initialize
          (TPZBlockDiagonal<std::complex<double>_> *this,TPZVec<int> *blocksize)

{
  undefined8 *puVar1;
  int iVar2;
  int *piVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  int64_t newsize;
  long lVar7;
  int64_t iVar8;
  complex<double> local_28;
  
  lVar5 = blocksize->fNElements;
  TPZVec<int>::operator=(&this->fBlockSize,blocksize);
  local_28._M_value._0_8_ = 0;
  TPZVec<long>::Resize(&this->fBlockPos,lVar5 + 1,(long *)&local_28);
  if (lVar5 < 1) {
    newsize = 0;
    iVar8 = 0;
  }
  else {
    piVar3 = blocksize->fStore;
    plVar4 = (this->fBlockPos).fStore;
    lVar6 = *plVar4;
    lVar7 = 0;
    iVar8 = 0;
    newsize = 0;
    do {
      iVar2 = piVar3[lVar7];
      iVar8 = iVar8 + iVar2;
      lVar6 = lVar6 + (ulong)(uint)(iVar2 * iVar2);
      plVar4[lVar7 + 1] = lVar6;
      lVar7 = lVar7 + 1;
      newsize = newsize + (ulong)(uint)(iVar2 * iVar2);
    } while (lVar5 != lVar7);
  }
  lVar5 = (this->fStorage).fNElements;
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)(((this->fStorage).fStore)->_M_value + lVar6);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar6 = lVar6 + 0x10;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  local_28._M_value._0_8_ = 0;
  local_28._M_value._8_8_ = 0;
  TPZVec<std::complex<double>_>::Resize(&this->fStorage,newsize,&local_28);
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow = iVar8;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol = iVar8;
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::Initialize(const TPZVec<int> &blocksize){
	int64_t nblock = blocksize.NElements();
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Number of blocks \t" << nblock;
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	fBlockSize = blocksize;
	fBlockPos.Resize(nblock+1,0); 
	int64_t b;
	int64_t ndata = 0;
	int64_t neq = 0;
	int bsize;
	for(b=0; b<nblock; b++) {
		bsize = blocksize[b];
		fBlockPos[b+1] = fBlockPos[b]+bsize*bsize;
		ndata += bsize*bsize;
		neq += bsize;
	}
#ifdef PZ_LOG
	if(ndata > 10000000)
	{
		std::stringstream sout;
		sout << "Calling fStorage.Resize(ndata,0.) with ndata = " << ndata;
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	
	fStorage.Fill(0.,0);
	fStorage.Resize(ndata,0.);
	this->fDecomposed = 0;
	this->fRow = neq;
	this->fCol = neq;
}